

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  pointer pbVar1;
  pointer pcVar2;
  t_TestingHandlers *ptVar3;
  cmCTest *pcVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  _Rb_tree_node_base *p_Var12;
  bool SRArgumentSpecified;
  string errormsg;
  string arg;
  string targ;
  bool local_239;
  size_t local_238;
  uint local_230;
  int local_22c;
  ulong local_228;
  cmCTest *local_220;
  string local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  string *local_1d8;
  string *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_239 = false;
  local_1d8 = output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,
             (this->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_238 = 1;
  uVar11 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar11 < 0x21) {
    local_230 = (uint)CONCAT71((int7)(uVar11 >> 8),1);
    local_228 = 0;
  }
  else {
    local_1d0 = &this->ScheduleType;
    ptVar3 = &this->TestingHandlers;
    local_230 = (uint)CONCAT71((int7)((ulong)local_1d0 >> 8),1);
    local_228 = 0;
    local_220 = this;
    do {
      pcVar4 = local_220;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      bVar6 = HandleCommandLineArguments(local_220,&local_238,args,&local_218);
      if (bVar6) {
        HandleScriptArguments(pcVar4,&local_238,args,&local_239);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1f8[0] = local_1e8;
        pcVar2 = pbVar1[local_238]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar2,pcVar2 + pbVar1[local_238]._M_string_length);
        iVar9 = std::__cxx11::string::compare((char *)local_1f8);
        if (((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)local_1f8), iVar9 == 0))
           && (pbVar1 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_238 <
              ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U)) {
          pcVar4->ProduceXML = true;
          local_238 = local_238 + 1;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          pcVar2 = pbVar1[local_238]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + pbVar1[local_238]._M_string_length);
          bVar6 = AddTestsForDashboardType(pcVar4,local_1a8);
          if ((!bVar6) && (bVar6 = AddVariableDefinition(pcVar4,local_1a8), !bVar6)) {
            ErrorMessageUnknownDashDValue(pcVar4,local_1a8);
            local_230 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        iVar9 = std::__cxx11::string::compare((char *)local_1f8);
        if ((iVar9 != 0) &&
           (bVar6 = cmsys::SystemTools::StringStartsWith((char *)local_1f8[0],"-D"), bVar6)) {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_1f8);
          AddVariableDefinition(pcVar4,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        bVar7 = HandleTestActionArgument(pcVar4,"ctest",&local_238,args);
        bVar8 = HandleTestModelArgument(pcVar4,"ctest",&local_238,args);
        iVar9 = std::__cxx11::string::compare((char *)local_1f8);
        pcVar4 = local_220;
        if ((iVar9 == 0) &&
           (local_238 <
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          local_220->ProduceXML = true;
          SetTest(local_220,"Submit",true);
          local_238 = local_238 + 1;
          bVar6 = SubmitExtraFiles(pcVar4,(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[local_238].
                                          _M_dataplus._M_p);
          if (bVar6) goto LAB_00150265;
LAB_001503da:
          bVar6 = false;
          local_22c = 0;
        }
        else {
LAB_00150265:
          iVar9 = std::__cxx11::string::compare((char *)local_1f8);
          if (iVar9 == 0) {
            local_228 = CONCAT71((int7)(local_228 >> 8),
                                 (byte)local_228 |
                                 local_238 <
                                 ((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
          }
          iVar9 = std::__cxx11::string::compare((char *)local_1f8);
          pcVar4 = local_220;
          if (iVar9 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_1d0,0,(char *)(local_220->ScheduleType)._M_string_length,
                       0x532e92);
          }
          bVar6 = true;
          for (p_Var12 = (pcVar4->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var12 != &(ptVar3->_M_t)._M_impl.super__Rb_tree_header;
              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
            iVar9 = (**(code **)(**(long **)(p_Var12 + 2) + 0x10))
                              (*(long **)(p_Var12 + 2),(string *)local_1f8,&local_238,args);
            if (iVar9 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Problem parsing command line arguments within a handler",0x37);
              pcVar4 = local_220;
              std::__cxx11::stringbuf::str();
              Log(pcVar4,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
                  ,0x8c6,(char *)local_1c8,false);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_001503da;
            }
          }
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        local_230 = CONCAT31((int3)(local_230 >> 8),(byte)local_230 & (bVar7 && bVar8));
      }
      else {
        cmSystemTools::Error(&local_218);
        local_22c = 1;
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar6) {
        return local_22c;
      }
      local_238 = local_238 + 1;
      this = local_220;
    } while (local_238 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (this->ParallelLevelSetInCli == false) {
    local_1a8[0]._M_string_length = 0;
    local_1a8[0].field_2._M_local_buf[0] = '\0';
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    bVar6 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",local_1a8);
    _Var5._M_p = local_1a8[0]._M_dataplus._M_p;
    if (bVar6) {
      iVar10 = atoi(local_1a8[0]._M_dataplus._M_p);
      iVar9 = 1;
      if (1 < iVar10) {
        iVar9 = iVar10;
      }
      this->ParallelLevel = iVar9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != &local_1a8[0].field_2) {
      operator_delete(_Var5._M_p,
                      CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                               local_1a8[0].field_2._M_local_buf[0]) + 1);
    }
  }
  bVar6 = false;
  if ((this->TestProgressOutput == true) &&
     (bVar6 = false, this->OutputLogFile == (cmGeneratedFileStream *)0x0)) {
    bVar6 = ConsoleIsNotDumb();
  }
  this->TestProgressOutput = bVar6;
  if ((local_228 & 1) == 0) {
    iVar9 = 1;
    if ((local_230 & 1) != 0) {
      iVar9 = ExecuteTests(this);
    }
  }
  else {
    iVar9 = RunCMakeAndTest(this,local_1d8);
  }
  return iVar9;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
    this->InitialCommandLineArguments.end(), args.begin(), args.end());

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->TestingHandlers) {
      if (!handler.second->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->TestProgressOutput = this->TestProgressOutput &&
    !this->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}